

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

DWARFCompileUnit * __thiscall
llvm::DWARFContext::getDWOCompileUnitForHash(DWARFContext *this,uint64_t Hash)

{
  bool bVar1;
  DWARFUnitIndex *this_00;
  Entry *E;
  DWARFUnit *pDVar2;
  ret_type pDVar3;
  unsigned_long *puVar4;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar5;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar6;
  unit_iterator_range uVar7;
  Optional<unsigned_long> OVar8;
  anon_union_48_2_fc7899a5_for_OptionalStorage<llvm::DWARFFormValue,_true>_2 local_98;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_60;
  Optional<unsigned_long> DWOId;
  uint64_t local_40;
  uint64_t Hash_local;
  
  local_40 = Hash;
  parseDWOUnits(this,true);
  this_00 = getCUIndex(this);
  if ((this_00->Header).NumBuckets == 0) {
    uVar7 = dwo_info_section_units(this);
    Hash_local = (uint64_t)uVar7.end_iterator;
    while( true ) {
      puVar6 = uVar7.end_iterator;
      puVar5 = uVar7.begin_iterator;
      if (puVar5 == puVar6) break;
      OVar8 = DWARFUnit::getDWOId((puVar5->_M_t).
                                  super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                                  .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl);
      if (((undefined1  [16])OVar8.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        join_0x00000010_0x00000000_ =
             DWARFUnit::getUnitDIE
                       ((puVar5->_M_t).
                        super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                        .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl,true);
        DWARFDie::find((Optional<llvm::DWARFFormValue> *)&local_98.value,
                       (DWARFDie *)&DWOId.Storage.hasVal,DW_AT_GNU_dwo_id);
        OVar8 = dwarf::toUnsigned((Optional<llvm::DWARFFormValue> *)&local_98.value);
        local_60 = OVar8.Storage.field_0;
        DWOId.Storage.field_0.empty = OVar8.Storage.hasVal;
        if (((undefined1  [16])OVar8.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pDVar2 = (puVar5->_M_t).
                   super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
                   super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
          puVar4 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                             ((OptionalStorage<unsigned_long,_true> *)&local_60);
          puVar6 = (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)Hash_local;
          DWARFUnitHeader::setDWOId(&pDVar2->Header,*puVar4);
          goto LAB_00b247ad;
        }
      }
      else {
LAB_00b247ad:
        OVar8 = DWARFUnit::getDWOId((puVar5->_M_t).
                                    super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                                    .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl);
        local_98._0_8_ = OVar8.Storage.field_0;
        local_98._8_1_ = OVar8.Storage.hasVal;
        bVar1 = llvm::operator==((Optional<unsigned_long> *)&local_98.value,&local_40);
        if (bVar1) {
          pDVar3 = dyn_cast<llvm::DWARFCompileUnit,llvm::DWARFUnit>
                             ((puVar5->_M_t).
                              super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                              .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl);
          return pDVar3;
        }
      }
      uVar7.end_iterator = puVar6;
      uVar7.begin_iterator = puVar5 + 1;
    }
  }
  else {
    E = DWARFUnitIndex::getFromHash(this_00,Hash);
    if (E != (Entry *)0x0) {
      pDVar2 = DWARFUnitVector::getUnitForIndexEntry(&this->DWOUnits,E);
      pDVar3 = dyn_cast_or_null<llvm::DWARFCompileUnit,llvm::DWARFUnit>(pDVar2);
      return pDVar3;
    }
  }
  return (DWARFCompileUnit *)0x0;
}

Assistant:

DWARFCompileUnit *DWARFContext::getDWOCompileUnitForHash(uint64_t Hash) {
  parseDWOUnits(LazyParse);

  if (const auto &CUI = getCUIndex()) {
    if (const auto *R = CUI.getFromHash(Hash))
      return dyn_cast_or_null<DWARFCompileUnit>(
          DWOUnits.getUnitForIndexEntry(*R));
    return nullptr;
  }

  // If there's no index, just search through the CUs in the DWO - there's
  // probably only one unless this is something like LTO - though an in-process
  // built/cached lookup table could be used in that case to improve repeated
  // lookups of different CUs in the DWO.
  for (const auto &DWOCU : dwo_compile_units()) {
    // Might not have parsed DWO ID yet.
    if (!DWOCU->getDWOId()) {
      if (Optional<uint64_t> DWOId =
          toUnsigned(DWOCU->getUnitDIE().find(DW_AT_GNU_dwo_id)))
        DWOCU->setDWOId(*DWOId);
      else
        // No DWO ID?
        continue;
    }
    if (DWOCU->getDWOId() == Hash)
      return dyn_cast<DWARFCompileUnit>(DWOCU.get());
  }
  return nullptr;
}